

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O2

bool llvm::DWARFUnit::isMatchingUnitTypeAndTag(uint8_t UnitType,Tag Tag)

{
  undefined7 in_register_00000039;
  byte bVar1;
  
  switch((int)CONCAT71(in_register_00000039,UnitType)) {
  case 1:
    bVar1 = Tag == DW_TAG_compile_unit;
    break;
  case 2:
    bVar1 = Tag == DW_TAG_type_unit;
    break;
  case 3:
    bVar1 = Tag == DW_TAG_partial_unit;
    break;
  case 4:
    bVar1 = Tag == DW_TAG_skeleton_unit;
    break;
  case 5:
  case 6:
    if ((ushort)(Tag - DW_TAG_compile_unit) < 0x3a) {
      bVar1 = (byte)(0x201080000000001 >> ((byte)(Tag - DW_TAG_compile_unit) & 0x3f));
      break;
    }
  default:
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool isMatchingUnitTypeAndTag(uint8_t UnitType, dwarf::Tag Tag) {
    switch (UnitType) {
    case dwarf::DW_UT_compile:
      return Tag == dwarf::DW_TAG_compile_unit;
    case dwarf::DW_UT_type:
      return Tag == dwarf::DW_TAG_type_unit;
    case dwarf::DW_UT_partial:
      return Tag == dwarf::DW_TAG_partial_unit;
    case dwarf::DW_UT_skeleton:
      return Tag == dwarf::DW_TAG_skeleton_unit;
    case dwarf::DW_UT_split_compile:
    case dwarf::DW_UT_split_type:
      return dwarf::isUnitType(Tag);
    }
    return false;
  }